

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

string * __thiscall
spirv_cross::StringStream<4096ul,4096ul>::str_abi_cxx11_
          (string *__return_storage_ptr__,StringStream<4096ul,4096ul> *this)

{
  Buffer *saved;
  long lVar1;
  const_iterator __p;
  Buffer *saved_1;
  undefined8 *puVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (lVar1 = *(long *)(this + 0x1020) * 0x18; lVar1 != 0; lVar1 = lVar1 + -0x18) {
  }
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  puVar2 = *(undefined8 **)(this + 0x1018);
  for (lVar1 = *(long *)(this + 0x1020) * 0x18;
      __p._M_current =
           (__return_storage_ptr__->_M_dataplus)._M_p + __return_storage_ptr__->_M_string_length,
      lVar1 != 0; lVar1 = lVar1 + -0x18) {
    ::std::__cxx11::string::insert<char*,void>
              ((string *)__return_storage_ptr__,__p,(char *)*puVar2,(char *)*puVar2 + puVar2[1]);
    puVar2 = puVar2 + 3;
  }
  ::std::__cxx11::string::insert<char*,void>
            ((string *)__return_storage_ptr__,__p,*(char **)this,
             *(char **)this + *(long *)(this + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string str() const
	{
		std::string ret;
		size_t target_size = 0;
		for (auto &saved : saved_buffers)
			target_size += saved.offset;
		target_size += current_buffer.offset;
		ret.reserve(target_size);

		for (auto &saved : saved_buffers)
			ret.insert(ret.end(), saved.buffer, saved.buffer + saved.offset);
		ret.insert(ret.end(), current_buffer.buffer, current_buffer.buffer + current_buffer.offset);
		return ret;
	}